

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec_cfg.cpp
# Opt level: O2

void __thiscall MppDecCfgService::MppDecCfgService(MppDecCfgService *this)

{
  MPP_RET MVar1;
  RK_S32 RVar2;
  RK_S32 RVar3;
  MppCfgInfo tmp;
  
  this->mTrie = (MppTrie)0x0;
  MVar1 = mpp_trie_init(&this->mTrie,"MppDecCfg");
  if (MVar1 != MPP_OK) {
    _mpp_log_l(2,"mpp_dec_cfg","failed to init dec cfg set trie\n","MppDecCfgService");
    return;
  }
  tmp.data_type = CFG_FUNC_TYPE_U32;
  tmp.flag_offset = 0;
  tmp.flag_value = 1;
  tmp.data_offset = 8;
  RVar3 = 4;
  tmp.data_size = RVar3;
  mpp_trie_add_info(this->mTrie,"base:type",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_U32;
  tmp.flag_offset = 0;
  tmp.flag_value = 2;
  tmp.data_offset = 0xc;
  tmp.data_size = RVar3;
  mpp_trie_add_info(this->mTrie,"base:coding",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_U32;
  tmp.flag_offset = 0;
  tmp.flag_value = 4;
  tmp.data_offset = 0x10;
  tmp.data_size = RVar3;
  mpp_trie_add_info(this->mTrie,"base:hw_type",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_U32;
  tmp.flag_offset = 0;
  tmp.flag_value = 8;
  tmp.data_offset = 0x14;
  tmp.data_size = RVar3;
  mpp_trie_add_info(this->mTrie,"base:batch_mode",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_U32;
  tmp.flag_offset = 0;
  tmp.flag_value = 0x100;
  tmp.data_offset = 0x18;
  tmp.data_size = RVar3;
  mpp_trie_add_info(this->mTrie,"base:out_fmt",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_U32;
  tmp.flag_offset = 0;
  tmp.flag_value = 0x200;
  tmp.data_offset = 0x1c;
  tmp.data_size = RVar3;
  mpp_trie_add_info(this->mTrie,"base:fast_out",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_U32;
  tmp.flag_offset = 0;
  tmp.flag_value = 0x400;
  tmp.data_offset = 0x20;
  tmp.data_size = RVar3;
  mpp_trie_add_info(this->mTrie,"base:fast_parse",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_U32;
  tmp.flag_offset = 0;
  tmp.flag_value = 0x800;
  tmp.data_offset = 0x24;
  tmp.data_size = RVar3;
  mpp_trie_add_info(this->mTrie,"base:split_parse",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_U32;
  tmp.flag_offset = 0;
  tmp.flag_value = 0x1000;
  tmp.data_offset = 0x28;
  tmp.data_size = RVar3;
  mpp_trie_add_info(this->mTrie,"base:internal_pts",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_U32;
  tmp.flag_offset = 0;
  tmp.flag_value = 0x2000;
  tmp.data_offset = 0x2c;
  tmp.data_size = RVar3;
  mpp_trie_add_info(this->mTrie,"base:sort_pts",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_U32;
  tmp.flag_offset = 0;
  tmp.flag_value = 0x4000;
  tmp.data_offset = 0x30;
  tmp.data_size = RVar3;
  mpp_trie_add_info(this->mTrie,"base:disable_error",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_U32;
  tmp.flag_offset = 0;
  tmp.flag_value = 0x8000;
  tmp.data_offset = 0x34;
  tmp.data_size = RVar3;
  mpp_trie_add_info(this->mTrie,"base:enable_vproc",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_U32;
  tmp.flag_offset = 0;
  tmp.flag_value = 0x10000;
  tmp.data_offset = 0x38;
  tmp.data_size = RVar3;
  mpp_trie_add_info(this->mTrie,"base:enable_fast_play",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_U32;
  tmp.flag_offset = 0;
  tmp.flag_value = 0x20000;
  tmp.data_offset = 0x3c;
  tmp.data_size = RVar3;
  mpp_trie_add_info(this->mTrie,"base:enable_hdr_meta",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_U32;
  tmp.flag_offset = 0;
  tmp.flag_value = 0x40000;
  tmp.data_offset = 0x40;
  tmp.data_size = RVar3;
  mpp_trie_add_info(this->mTrie,"base:enable_thumbnail",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_U32;
  tmp.flag_offset = 0;
  tmp.flag_value = 0x80000;
  tmp.data_offset = 0x44;
  tmp.data_size = RVar3;
  mpp_trie_add_info(this->mTrie,"base:enable_mvc",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_U32;
  tmp.flag_offset = 0;
  tmp.flag_value = 0x100000;
  tmp.data_offset = 0x48;
  tmp.data_size = RVar3;
  mpp_trie_add_info(this->mTrie,"base:disable_dpb_chk",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_U32;
  tmp.flag_offset = 0;
  tmp.flag_value = 0x10000000;
  tmp.data_offset = 0x4c;
  tmp.data_size = RVar3;
  mpp_trie_add_info(this->mTrie,"base:disable_thread",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_U32;
  tmp.flag_offset = 0;
  tmp.flag_value = 0x20000000;
  tmp.data_offset = 0x50;
  tmp.data_size = RVar3;
  mpp_trie_add_info(this->mTrie,"base:codec_mode",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_U32;
  tmp.flag_offset = 0;
  tmp.flag_value = 0x40000000;
  tmp.data_offset = 0x54;
  tmp.data_size = RVar3;
  mpp_trie_add_info(this->mTrie,"base:dis_err_clr_mark",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_Ptr;
  tmp.flag_offset = 0x68;
  tmp.flag_value = 1;
  tmp.data_offset = 0x70;
  RVar2 = 8;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"cb:pkt_rdy_cb",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_Ptr;
  tmp.flag_offset = 0x68;
  tmp.flag_value = 1;
  tmp.data_offset = 0x78;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"cb:pkt_rdy_ctx",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x68;
  tmp.flag_value = 1;
  tmp.data_offset = 0x80;
  tmp.data_size = RVar3;
  mpp_trie_add_info(this->mTrie,"cb:pkt_rdy_cmd",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_Ptr;
  tmp.flag_offset = 0x68;
  tmp.flag_value = 2;
  tmp.data_offset = 0x88;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"cb:frm_rdy_cb",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_Ptr;
  tmp.flag_offset = 0x68;
  tmp.flag_value = 2;
  tmp.data_offset = 0x90;
  tmp.data_size = RVar2;
  mpp_trie_add_info(this->mTrie,"cb:frm_rdy_ctx",&tmp,0x14);
  tmp.data_type = CFG_FUNC_TYPE_S32;
  tmp.flag_offset = 0x68;
  tmp.flag_value = 2;
  tmp.data_offset = 0x98;
  tmp.data_size = RVar3;
  mpp_trie_add_info(this->mTrie,"cb:frm_rdy_cmd",&tmp,0x14);
  mpp_trie_add_info(this->mTrie,(char *)0x0,(void *)0x0,0);
  RVar2 = mpp_trie_get_node_count(this->mTrie);
  (this->mHead).node_count = RVar2;
  RVar2 = mpp_trie_get_info_count(this->mTrie);
  (this->mHead).info_count = RVar2;
  RVar2 = mpp_trie_get_buf_size(this->mTrie);
  (this->mHead).info_size = RVar2;
  if (((byte)mpp_dec_cfg_debug & 1) != 0) {
    _mpp_log_l(4,"mpp_dec_cfg","node cnt: %d\n","MppDecCfgService",
               (ulong)(uint)(this->mHead).node_count);
  }
  return;
}

Assistant:

MppDecCfgService::MppDecCfgService() :
    mTrie(NULL)
{
    MPP_RET ret = mpp_trie_init(&mTrie, "MppDecCfg");
    if (ret) {
        mpp_err_f("failed to init dec cfg set trie\n");
        return ;
    }

    ENTRY_TABLE(EXPAND_AS_TRIE)

    mpp_trie_add_info(mTrie, NULL, NULL, 0);

    mHead.node_count = mpp_trie_get_node_count(mTrie);
    mHead.info_count = mpp_trie_get_info_count(mTrie);
    mHead.info_size = mpp_trie_get_buf_size(mTrie);

    mpp_dec_cfg_dbg_func("node cnt: %d\n", mHead.node_count);
}